

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_cuda.c
# Opt level: O0

P * malloc_device_P(size_t n)

{
  P *result;
  size_t n_local;
  
  if (n != 0xffffffffffffffff) {
    return (P *)0x0;
  }
  __assert_fail("n+1 >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/env_cuda.c"
                ,0x98,"P *malloc_device_P(size_t)");
}

Assistant:

P* malloc_device_P( size_t n )
{
  Assert( n+1 >= 1 );

  P* result = NULL;

#ifdef USE_CUDA
  cudaMalloc( &result, n==0 ? ((size_t)1) : n*sizeof(P) );
  Assert( Env_cuda_last_call_succeeded() );
  Assert( result );
#endif

  return result;
}